

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SMBusSimulationDataGenerator::OutputWriteWord
          (SMBusSimulationDataGenerator *this,U8 command,U16 data_word)

{
  byte bVar1;
  U8 byte;
  bool is_ack;
  char cVar2;
  byte byte_00;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,command,true);
  byte_00 = (byte)(data_word >> 8);
  OutputByte(this,byte_00,true);
  bVar1 = ""[command ^ 0x9b];
  is_ack = (bool)AnalyzerSettingInterfaceBool::GetValue();
  OutputByte(this,(byte)data_word,is_ack);
  byte = ""[(byte)((byte)data_word ^ ""[bVar1 ^ byte_00])];
  cVar2 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar2 != '\0') {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputWriteWord( U8 command, U16 data_word )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( command ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( U8( data_word >> 8 ) ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( U8( data_word & 0xff ), mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}